

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AngleR.cpp
# Opt level: O0

void __thiscall
OpenMD::AngleR::AngleR
          (AngleR *this,SimInfo *info,string *filename,string *sele1,string *sele2,RealType len,
          int nrbins)

{
  undefined1 uVar1;
  undefined1 uVar2;
  ostream *this_00;
  StaticAnalyser *this_01;
  string *psVar3;
  string *in_RCX;
  undefined8 *in_RDI;
  string *in_R8;
  undefined4 in_R9D;
  undefined8 in_XMM0_Qa;
  string paramString;
  stringstream params;
  string *in_stack_fffffffffffffca8;
  StaticAnalyser *in_stack_fffffffffffffcb0;
  SimInfo *in_stack_fffffffffffffcb8;
  StaticAnalyser *in_stack_fffffffffffffcc0;
  undefined8 *in_stack_fffffffffffffcc8;
  undefined7 in_stack_fffffffffffffcd0;
  undefined7 in_stack_fffffffffffffce0;
  SelectionEvaluator *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_03;
  SelectionEvaluator *this_04;
  string local_2c8 [32];
  stringstream local_2a8 [16];
  ostream local_298 [64];
  SimInfo *in_stack_fffffffffffffda8;
  SelectionEvaluator *in_stack_fffffffffffffdb0;
  string local_120 [32];
  string local_100 [39];
  allocator<char> local_d9;
  string local_d8 [48];
  SimInfo *in_stack_ffffffffffffff58;
  SelectionManager *in_stack_ffffffffffffff60;
  string local_88 [32];
  string local_68 [52];
  undefined4 local_34;
  undefined8 local_30;
  string *local_28;
  string *local_20;
  
  local_34 = in_R9D;
  local_30 = in_XMM0_Qa;
  local_28 = in_R8;
  local_20 = in_RCX;
  StaticAnalyser::StaticAnalyser
            (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,(string *)in_stack_fffffffffffffcb0
             ,(uint)((ulong)in_stack_fffffffffffffca8 >> 0x20));
  *in_RDI = &PTR__AngleR_0055e748;
  *(undefined1 *)(in_RDI + 0x1a) = 0;
  *(undefined1 *)((long)in_RDI + 0xd1) = 0;
  std::__cxx11::string::string((string *)(in_RDI + 0x1b),local_20);
  std::__cxx11::string::string((string *)(in_RDI + 0x1f),local_28);
  SelectionManager::SelectionManager(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  SelectionManager::SelectionManager(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  SelectionEvaluator::SelectionEvaluator(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  this_04 = (SelectionEvaluator *)(in_RDI + 0xff);
  SelectionEvaluator::SelectionEvaluator(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  in_RDI[0x1ab] = local_30;
  *(undefined4 *)(in_RDI + 0x1ac) = local_34;
  this_02 = (SelectionEvaluator *)(in_RDI + 0x1ae);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x130d60);
  this_03 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x1b1);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x130d79);
  psVar3 = (string *)(in_RDI + 0x1b4);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x130d92);
  getPrefix((string *)in_stack_fffffffffffffcb8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffcb8,(char *)in_stack_fffffffffffffcb0);
  StaticAnalyser::setOutputName(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_88);
  SelectionEvaluator::loadScriptString(this_04,psVar3);
  uVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x55));
  if (!(bool)uVar1) {
    SelectionEvaluator::evaluate(this_02);
    SelectionManager::setSelectionSet
              ((SelectionManager *)in_stack_fffffffffffffcc0,
               (SelectionSet *)in_stack_fffffffffffffcb8);
    SelectionSet::~SelectionSet((SelectionSet *)0x130e8b);
  }
  SelectionEvaluator::loadScriptString(this_04,psVar3);
  uVar2 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0xff));
  if (!(bool)uVar2) {
    in_stack_fffffffffffffcc8 = in_RDI + 0x3c;
    SelectionEvaluator::evaluate(this_02);
    SelectionManager::setSelectionSet
              ((SelectionManager *)in_stack_fffffffffffffcc0,
               (SelectionSet *)in_stack_fffffffffffffcb8);
    SelectionSet::~SelectionSet((SelectionSet *)0x13103d);
  }
  in_RDI[0x1ad] = (double)in_RDI[0x1ab] / (double)*(int *)(in_RDI + 0x1ac);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)CONCAT17(uVar2,in_stack_fffffffffffffcd0),
             (size_type)in_stack_fffffffffffffcc8);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)CONCAT17(uVar2,in_stack_fffffffffffffcd0),
             (size_type)in_stack_fffffffffffffcc8);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)CONCAT17(uVar2,in_stack_fffffffffffffcd0),
             (size_type)in_stack_fffffffffffffcc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_03,(char *)this_02,(allocator<char> *)CONCAT17(uVar1,in_stack_fffffffffffffce0));
  StaticAnalyser::setAnalysisType(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator(&local_d9);
  getPrefix((string *)in_stack_fffffffffffffcb8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffcb8,(char *)in_stack_fffffffffffffcb0);
  StaticAnalyser::setOutputName(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  std::__cxx11::string::~string(local_100);
  std::__cxx11::string::~string(local_120);
  std::__cxx11::stringstream::stringstream(local_2a8);
  this_00 = std::operator<<(local_298," len = ");
  this_01 = (StaticAnalyser *)std::ostream::operator<<(this_00,(double)in_RDI[0x1ab]);
  psVar3 = (string *)std::operator<<((ostream *)this_01,", nrbins = ");
  std::ostream::operator<<(psVar3,*(int *)(in_RDI + 0x1ac));
  std::__cxx11::stringstream::str();
  StaticAnalyser::setParameterString(this_01,psVar3);
  std::__cxx11::string::~string(local_2c8);
  std::__cxx11::stringstream::~stringstream(local_2a8);
  return;
}

Assistant:

AngleR::AngleR(SimInfo* info, const std::string& filename,
                 const std::string& sele1, const std::string& sele2,
                 RealType len, int nrbins) :
      StaticAnalyser(info, filename, nrbins),
      doVect_(false), doOffset_(false), selectionScript1_(sele1),
      selectionScript2_(sele2), seleMan1_(info), seleMan2_(info),
      evaluator1_(info), evaluator2_(info), len_(len), nRBins_(nrbins) {
    setOutputName(getPrefix(filename) + ".AngleR");

    evaluator1_.loadScriptString(sele1);
    if (!evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
    }

    evaluator2_.loadScriptString(sele2);
    if (!evaluator2_.isDynamic()) {
      seleMan2_.setSelectionSet(evaluator2_.evaluate());
    }

    deltaR_ = len_ / nRBins_;

    histogram_.resize(nRBins_);
    count_.resize(nRBins_);
    avgAngleR_.resize(nRBins_);

    setAnalysisType("radial density function Angle(r)");
    setOutputName(getPrefix(filename) + ".AngleR");
    std::stringstream params;
    params << " len = " << len_ << ", nrbins = " << nRBins_;
    const std::string paramString = params.str();
    setParameterString(paramString);
  }